

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

void glfwSetGammaRamp(GLFWmonitor *handle,GLFWgammaramp *ramp)

{
  GLFWbool GVar1;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                  ,0x205,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  if (ramp == (GLFWgammaramp *)0x0) {
    __assert_fail("ramp != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                  ,0x206,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  if (ramp->size == 0) {
    __assert_fail("ramp->size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                  ,0x207,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  if (ramp->red != (unsigned_short *)0x0) {
    if (ramp->green == (unsigned_short *)0x0) {
      __assert_fail("ramp->green != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                    ,0x209,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
    }
    if (ramp->blue != (unsigned_short *)0x0) {
      if (_glfw.initialized == 0) {
        _glfwInputError(0x10001,(char *)0x0);
        return;
      }
      if (*(int *)(handle + 0xd8) == 0) {
        GVar1 = _glfwPlatformGetGammaRamp((_GLFWmonitor *)handle,(GLFWgammaramp *)(handle + 0xc0));
        if (GVar1 == 0) {
          return;
        }
      }
      _glfwPlatformSetGammaRamp((_GLFWmonitor *)handle,ramp);
      return;
    }
    __assert_fail("ramp->blue != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                  ,0x20a,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  __assert_fail("ramp->red != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                ,0x208,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
}

Assistant:

GLFWAPI void glfwSetGammaRamp(GLFWmonitor* handle, const GLFWgammaramp* ramp)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(ramp != NULL);
    assert(ramp->size > 0);
    assert(ramp->red != NULL);
    assert(ramp->green != NULL);
    assert(ramp->blue != NULL);

    if (ramp->size <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid gamma ramp size %i",
                        ramp->size);
        return;
    }

    _GLFW_REQUIRE_INIT();

    if (!monitor->originalRamp.size)
    {
        if (!_glfwPlatformGetGammaRamp(monitor, &monitor->originalRamp))
            return;
    }

    _glfwPlatformSetGammaRamp(monitor, ramp);
}